

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O0

void FDynamicColormap::RebuildAllLights(void)

{
  uint uVar1;
  BYTE *pBVar2;
  FDynamicColormap *local_10;
  FDynamicColormap *cm;
  
  uVar1 = (*Renderer->_vptr_FRenderer[2])();
  if ((uVar1 & 1) != 0) {
    for (local_10 = &NormalLight; local_10 != (FDynamicColormap *)0x0; local_10 = local_10->Next) {
      if (local_10->Maps == (BYTE *)0x0) {
        pBVar2 = (BYTE *)operator_new__(0x2000);
        local_10->Maps = pBVar2;
        BuildLights(local_10);
      }
    }
  }
  return;
}

Assistant:

void FDynamicColormap::RebuildAllLights()
{
	if (Renderer->UsesColormap())
	{
		FDynamicColormap *cm;

		for (cm = &NormalLight; cm != NULL; cm = cm->Next)
		{
			if (cm->Maps == NULL)
			{
				cm->Maps = new BYTE[NUMCOLORMAPS*256];
				cm->BuildLights ();
			}
		}
	}
}